

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-tls.c
# Opt level: O2

char * lws_ssl_get_error_string(int status,int ret,char *buf,size_t len)

{
  int *piVar1;
  char *pcVar2;
  
  switch(status) {
  case 0:
    pcVar2 = "SSL_ERROR_NONE";
    break;
  case 1:
    return "SSL_ERROR_SSL";
  case 2:
    pcVar2 = "SSL_ERROR_WANT_READ";
    break;
  case 3:
    pcVar2 = "SSL_ERROR_WANT_WRITE";
    break;
  case 4:
    pcVar2 = "SSL_ERROR_WANT_X509_LOOKUP";
    break;
  case 5:
    if (ret == -1) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      lws_snprintf(buf,len,"SSL_ERROR_SYSCALL: %s",pcVar2);
      return buf;
    }
    if (ret == 0) {
      lws_snprintf(buf,len,"SSL_ERROR_SYSCALL: EOF");
      return buf;
    }
    pcVar2 = strncpy(buf,"SSL_ERROR_SYSCALL",len);
    return pcVar2;
  case 6:
    pcVar2 = "SSL_ERROR_ZERO_RETURN";
    break;
  case 7:
    pcVar2 = "SSL_ERROR_WANT_CONNECT";
    break;
  case 8:
    pcVar2 = "SSL_ERROR_WANT_ACCEPT";
    break;
  default:
    return "SSL_ERROR_UNKNOWN";
  }
  pcVar2 = lws_strncpy(buf,pcVar2,len);
  return pcVar2;
}

Assistant:

char* lws_ssl_get_error_string(int status, int ret, char *buf, size_t len) {
	switch (status) {
	case SSL_ERROR_NONE:
		return lws_strncpy(buf, "SSL_ERROR_NONE", len);
	case SSL_ERROR_ZERO_RETURN:
		return lws_strncpy(buf, "SSL_ERROR_ZERO_RETURN", len);
	case SSL_ERROR_WANT_READ:
		return lws_strncpy(buf, "SSL_ERROR_WANT_READ", len);
	case SSL_ERROR_WANT_WRITE:
		return lws_strncpy(buf, "SSL_ERROR_WANT_WRITE", len);
	case SSL_ERROR_WANT_CONNECT:
		return lws_strncpy(buf, "SSL_ERROR_WANT_CONNECT", len);
	case SSL_ERROR_WANT_ACCEPT:
		return lws_strncpy(buf, "SSL_ERROR_WANT_ACCEPT", len);
	case SSL_ERROR_WANT_X509_LOOKUP:
		return lws_strncpy(buf, "SSL_ERROR_WANT_X509_LOOKUP", len);
	case SSL_ERROR_SYSCALL:
		switch (ret) {
                case 0:
                        lws_snprintf(buf, len, "SSL_ERROR_SYSCALL: EOF");
                        return buf;
                case -1:
#ifndef LWS_PLAT_OPTEE
			lws_snprintf(buf, len, "SSL_ERROR_SYSCALL: %s",
				     strerror(errno));
#else
			lws_snprintf(buf, len, "SSL_ERROR_SYSCALL: %d", errno);
#endif
			return buf;
                default:
                        return strncpy(buf, "SSL_ERROR_SYSCALL", len);
	}
	case SSL_ERROR_SSL:
		return "SSL_ERROR_SSL";
	default:
		return "SSL_ERROR_UNKNOWN";
	}
}